

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

MAP_HANDLE Map_Clone(MAP_HANDLE handle)

{
  size_t count;
  int iVar1;
  MAP_HANDLE __ptr;
  char **__ptr_00;
  char **ppcVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  size_t sVar5;
  
  if (handle == (MAP_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid arg to Map_Clone (NULL)";
      iVar1 = 0x6c;
LAB_001770fe:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                ,"Map_Clone",iVar1,1,pcVar4);
      return (MAP_HANDLE)0x0;
    }
  }
  else {
    __ptr = (MAP_HANDLE)calloc(1,0x20);
    if (__ptr == (MAP_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar4 = "unable to malloc";
        iVar1 = 0x76;
        goto LAB_001770fe;
      }
    }
    else {
      count = handle->count;
      if (count == 0) {
        return __ptr;
      }
      __ptr->mapFilterCallback = handle->mapFilterCallback;
      __ptr->count = count;
      __ptr_00 = Map_CloneVector(handle->keys,count);
      __ptr->keys = __ptr_00;
      if (__ptr_00 == (char **)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                    ,"Map_Clone",0x88,1,"unable to clone keys");
        }
      }
      else {
        ppcVar2 = Map_CloneVector(handle->values,handle->count);
        __ptr->values = ppcVar2;
        if (ppcVar2 != (char **)0x0) {
          return __ptr;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                    ,"Map_Clone",0x90,1,"unable to clone values");
        }
        for (sVar5 = 0; count != sVar5; sVar5 = sVar5 + 1) {
          free(__ptr_00[sVar5]);
        }
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (MAP_HANDLE)0x0;
}

Assistant:

MAP_HANDLE Map_Clone(MAP_HANDLE handle)
{
    MAP_HANDLE_DATA* result;
    if (handle == NULL)
    {
        /*Codes_SRS_MAP_02_038: [Map_Clone returns NULL if parameter handle is NULL.]*/
        result = NULL;
        LogError("invalid arg to Map_Clone (NULL)");
    }
    else
    {
        MAP_HANDLE_DATA * handleData = (MAP_HANDLE_DATA *)handle;
        result = (MAP_HANDLE_DATA*)calloc(1, sizeof(MAP_HANDLE_DATA));
        if (result == NULL)
        {
            /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
            /*do nothing, proceed to return it, this is an error case*/
            LogError("unable to malloc");
        }
        else
        {
            if (handleData->count == 0)
            {
                result->count = 0;
                result->keys = NULL;
                result->values = NULL;
                result->mapFilterCallback = NULL;
            }
            else
            {
                result->mapFilterCallback = handleData->mapFilterCallback;
                result->count = handleData->count;
                if( (result->keys = Map_CloneVector((const char* const*)handleData->keys, handleData->count))==NULL)
                {
                    /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
                    LogError("unable to clone keys");
                    free(result);
                    result = NULL;
                }
                else if ((result->values = Map_CloneVector((const char* const*)handleData->values, handleData->count)) == NULL)
                {
                    size_t i;
                    /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
                    LogError("unable to clone values");
                    for (i = 0; i < result->count; i++)
                    {
                        free(result->keys[i]);
                    }
                    free(result->keys);
                    free(result);
                    result = NULL;
                }
                else
                {
                    /*all fine, return it*/
                }
            }
        }
    }
    return (MAP_HANDLE)result;
}